

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.hpp
# Opt level: O2

void __thiscall helics::PublicationInfo::~PublicationInfo(PublicationInfo *this)

{
  std::__cxx11::string::~string((string *)&this->destTargets);
  SmallBuffer::~SmallBuffer(&this->data);
  std::__cxx11::string::~string((string *)&this->units);
  std::__cxx11::string::~string((string *)&this->type);
  std::__cxx11::string::~string((string *)&this->key);
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  ~vector(&this->subscribers);
  return;
}

Assistant:

PublicationInfo(GlobalHandle pid,
                    std::string_view pkey,
                    std::string_view ptype,
                    std::string_view punits): id(pid), key(pkey), type(ptype), units(punits)
    {
    }